

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress1X_DCtx_wksp
                 (HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize)

{
  U32 UVar1;
  undefined8 local_50;
  U32 algoNb;
  void *workSpace_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t dstSize_local;
  void *dst_local;
  HUF_DTable *dctx_local;
  
  if (dstSize == 0) {
    dctx_local = (HUF_DTable *)0xffffffffffffffba;
  }
  else if (dstSize < cSrcSize) {
    dctx_local = (HUF_DTable *)0xffffffffffffffec;
  }
  else {
    dctx_local = (HUF_DTable *)dstSize;
    if (cSrcSize == dstSize) {
      memcpy(dst,cSrc,dstSize);
    }
    else if (cSrcSize == 1) {
      memset(dst,(uint)*cSrc,dstSize);
    }
    else {
      UVar1 = HUF_selectDecoder(dstSize,cSrcSize);
      if (UVar1 == 0) {
        local_50 = (HUF_DTable *)
                   HUF_decompress1X1_DCtx_wksp(dctx,dst,dstSize,cSrc,cSrcSize,workSpace,wkspSize);
      }
      else {
        local_50 = (HUF_DTable *)
                   HUF_decompress1X2_DCtx_wksp(dctx,dst,dstSize,cSrc,cSrcSize,workSpace,wkspSize);
      }
      dctx_local = local_50;
    }
  }
  return (size_t)dctx_local;
}

Assistant:

size_t HUF_decompress1X_DCtx_wksp(HUF_DTable* dctx, void* dst, size_t dstSize,
                                  const void* cSrc, size_t cSrcSize,
                                  void* workSpace, size_t wkspSize)
{
    /* validation checks */
    if (dstSize == 0) return ERROR(dstSize_tooSmall);
    if (cSrcSize > dstSize) return ERROR(corruption_detected);   /* invalid */
    if (cSrcSize == dstSize) { memcpy(dst, cSrc, dstSize); return dstSize; }   /* not compressed */
    if (cSrcSize == 1) { memset(dst, *(const BYTE*)cSrc, dstSize); return dstSize; }   /* RLE */

    {   U32 const algoNb = HUF_selectDecoder(dstSize, cSrcSize);
#if defined(HUF_FORCE_DECOMPRESS_X1)
        (void)algoNb;
        assert(algoNb == 0);
        return HUF_decompress1X1_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
        (void)algoNb;
        assert(algoNb == 1);
        return HUF_decompress1X2_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize);
#else
        return algoNb ? HUF_decompress1X2_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize):
                        HUF_decompress1X1_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize);
#endif
    }
}